

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29931::TestTestWithUnspecifiedSuiteGetsDefaultSuite::RunImpl
          (TestTestWithUnspecifiedSuiteGetsDefaultSuite *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails TStack_68;
  Test test;
  
  UnitTest::Test::Test(&test,"test","DefaultSuite","",0);
  if (test.m_details.suiteName == (char *)0x0) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_68,*ppTVar3,0x66);
    UnitTest::TestResults::OnTestFailure(pTVar1,&TStack_68,"test.m_details.suiteName != NULL");
  }
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_68,*ppTVar3,0x67);
  UnitTest::CheckEqual(pTVar1,"DefaultSuite",test.m_details.suiteName,&TStack_68);
  UnitTest::Test::~Test(&test);
  return;
}

Assistant:

TEST(TestWithUnspecifiedSuiteGetsDefaultSuite)
{
    Test test("test");
    CHECK(test.m_details.suiteName != NULL);
    CHECK_EQUAL("DefaultSuite", test.m_details.suiteName);
}